

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Visitor<wasm::PrintSExpression,_void>::visit
          (Visitor<wasm::PrintSExpression,_void> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::PrintSExpression,_void> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      PrintSExpression::visitBlock((PrintSExpression *)this,(Block *)curr);
      break;
    case IfId:
      PrintSExpression::visitIf((PrintSExpression *)this,(If *)curr);
      break;
    case LoopId:
      PrintSExpression::visitLoop((PrintSExpression *)this,(Loop *)curr);
      break;
    case BreakId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitBreak
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Break *)curr);
      break;
    case SwitchId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSwitch
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Switch *)curr);
      break;
    case CallId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitCall
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Call *)curr);
      break;
    case CallIndirectId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitCallIndirect
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(CallIndirect *)curr
                );
      break;
    case LocalGetId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitLocalGet
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(LocalGet *)curr);
      break;
    case LocalSetId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitLocalSet
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(LocalSet *)curr);
      break;
    case GlobalGetId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitGlobalGet
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(GlobalGet *)curr);
      break;
    case GlobalSetId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitGlobalSet
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(GlobalSet *)curr);
      break;
    case LoadId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitLoad
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Load *)curr);
      break;
    case StoreId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitStore
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Store *)curr);
      break;
    case ConstId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitConst
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Const *)curr);
      break;
    case UnaryId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitUnary
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Unary *)curr);
      break;
    case BinaryId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitBinary
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Binary *)curr);
      break;
    case SelectId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSelect
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Select *)curr);
      break;
    case DropId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitDrop
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Drop *)curr);
      break;
    case ReturnId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitReturn
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Return *)curr);
      break;
    case MemorySizeId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitMemorySize
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(MemorySize *)curr);
      break;
    case MemoryGrowId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitMemoryGrow
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(MemoryGrow *)curr);
      break;
    case NopId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitNop
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Nop *)curr);
      break;
    case UnreachableId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitUnreachable
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Unreachable *)curr)
      ;
      break;
    case AtomicRMWId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitAtomicRMW
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitAtomicCmpxchg
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,
                 (AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitAtomicWait
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitAtomicNotify
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(AtomicNotify *)curr
                );
      break;
    case AtomicFenceId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitAtomicFence
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(AtomicFence *)curr)
      ;
      break;
    case SIMDExtractId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSIMDExtract
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(SIMDExtract *)curr)
      ;
      break;
    case SIMDReplaceId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSIMDReplace
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(SIMDReplace *)curr)
      ;
      break;
    case SIMDShuffleId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSIMDShuffle
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(SIMDShuffle *)curr)
      ;
      break;
    case SIMDTernaryId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSIMDTernary
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(SIMDTernary *)curr)
      ;
      break;
    case SIMDShiftId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSIMDShift
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(SIMDShift *)curr);
      break;
    case SIMDLoadId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSIMDLoad
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSIMDLoadStoreLane
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,
                 (SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitMemoryInit
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(MemoryInit *)curr);
      break;
    case DataDropId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitDataDrop
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(DataDrop *)curr);
      break;
    case MemoryCopyId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitMemoryCopy
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(MemoryCopy *)curr);
      break;
    case MemoryFillId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitMemoryFill
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(MemoryFill *)curr);
      break;
    case PopId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitPop
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Pop *)curr);
      break;
    case RefNullId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitRefNull
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(RefNull *)curr);
      break;
    case RefIsNullId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitRefIsNull
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(RefIsNull *)curr);
      break;
    case RefFuncId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitRefFunc
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(RefFunc *)curr);
      break;
    case RefEqId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitRefEq
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(RefEq *)curr);
      break;
    case TableGetId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitTableGet
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(TableGet *)curr);
      break;
    case TableSetId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitTableSet
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(TableSet *)curr);
      break;
    case TableSizeId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitTableSize
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(TableSize *)curr);
      break;
    case TableGrowId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitTableGrow
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(TableGrow *)curr);
      break;
    case TableFillId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitTableFill
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(TableFill *)curr);
      break;
    case TableCopyId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitTableCopy
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(TableCopy *)curr);
      break;
    case TableInitId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitTableInit
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(TableInit *)curr);
      break;
    case TryId:
      PrintSExpression::visitTry((PrintSExpression *)this,(Try *)curr);
      break;
    case TryTableId:
      PrintSExpression::visitTryTable((PrintSExpression *)this,(TryTable *)curr);
      break;
    case ThrowId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitThrow
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Throw *)curr);
      break;
    case RethrowId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitRethrow
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Rethrow *)curr);
      break;
    case ThrowRefId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitThrowRef
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(ThrowRef *)curr);
      break;
    case TupleMakeId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitTupleMake
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(TupleMake *)curr);
      break;
    case TupleExtractId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitTupleExtract
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(TupleExtract *)curr
                );
      break;
    case RefI31Id:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitRefI31
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(RefI31 *)curr);
      break;
    case I31GetId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitI31Get
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(I31Get *)curr);
      break;
    case CallRefId:
      PrintSExpression::visitCallRef((PrintSExpression *)this,(CallRef *)curr);
      break;
    case RefTestId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitRefTest
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(RefTest *)curr);
      break;
    case RefCastId:
      PrintSExpression::visitRefCast((PrintSExpression *)this,(RefCast *)curr);
      break;
    case BrOnId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitBrOn
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(BrOn *)curr);
      break;
    case StructNewId:
      PrintSExpression::visitStructNew((PrintSExpression *)this,(StructNew *)curr);
      break;
    case StructGetId:
      PrintSExpression::visitStructGet((PrintSExpression *)this,(StructGet *)curr);
      break;
    case StructSetId:
      PrintSExpression::visitStructSet((PrintSExpression *)this,(StructSet *)curr);
      break;
    case StructRMWId:
      PrintSExpression::visitStructRMW((PrintSExpression *)this,(StructRMW *)curr);
      break;
    case StructCmpxchgId:
      PrintSExpression::visitStructCmpxchg((PrintSExpression *)this,(StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      PrintSExpression::visitArrayNew((PrintSExpression *)this,(ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      PrintSExpression::visitArrayNewData((PrintSExpression *)this,(ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      PrintSExpression::visitArrayNewElem((PrintSExpression *)this,(ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      PrintSExpression::visitArrayNewFixed((PrintSExpression *)this,(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      PrintSExpression::visitArrayGet((PrintSExpression *)this,(ArrayGet *)curr);
      break;
    case ArraySetId:
      PrintSExpression::visitArraySet((PrintSExpression *)this,(ArraySet *)curr);
      break;
    case ArrayLenId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitArrayLen
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(ArrayLen *)curr);
      break;
    case ArrayCopyId:
      PrintSExpression::visitArrayCopy((PrintSExpression *)this,(ArrayCopy *)curr);
      break;
    case ArrayFillId:
      PrintSExpression::visitArrayFill((PrintSExpression *)this,(ArrayFill *)curr);
      break;
    case ArrayInitDataId:
      PrintSExpression::visitArrayInitData((PrintSExpression *)this,(ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      PrintSExpression::visitArrayInitElem((PrintSExpression *)this,(ArrayInitElem *)curr);
      break;
    case RefAsId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitRefAs
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(RefAs *)curr);
      break;
    case StringNewId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitStringNew
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(StringNew *)curr);
      break;
    case StringConstId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitStringConst
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(StringConst *)curr)
      ;
      break;
    case StringMeasureId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitStringMeasure
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,
                 (StringMeasure *)curr);
      break;
    case StringEncodeId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitStringEncode
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(StringEncode *)curr
                );
      break;
    case StringConcatId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitStringConcat
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(StringConcat *)curr
                );
      break;
    case StringEqId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitStringEq
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(StringEq *)curr);
      break;
    case StringWTF16GetId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitStringWTF16Get
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,
                 (StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitStringSliceWTF
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,
                 (StringSliceWTF *)curr);
      break;
    case ContNewId:
      PrintSExpression::visitContNew((PrintSExpression *)this,(ContNew *)curr);
      break;
    case ContBindId:
      PrintSExpression::visitContBind((PrintSExpression *)this,(ContBind *)curr);
      break;
    case SuspendId:
      UnifiedExpressionVisitor<wasm::PrintSExpression,_void>::visitSuspend
                ((UnifiedExpressionVisitor<wasm::PrintSExpression,_void> *)this,(Suspend *)curr);
      break;
    case ResumeId:
      PrintSExpression::visitResume((PrintSExpression *)this,(Resume *)curr);
      break;
    case ResumeThrowId:
      PrintSExpression::visitResumeThrow((PrintSExpression *)this,(ResumeThrow *)curr);
      break;
    case StackSwitchId:
      PrintSExpression::visitStackSwitch((PrintSExpression *)this,(StackSwitch *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::PrintSExpression>::visit(Expression *) [SubType = wasm::PrintSExpression, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }